

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# delete.cpp
# Opt level: O2

void __thiscall setup::delete_entry::load(delete_entry *this,istream *is,info *i)

{
  byte bVar1;
  target_type tVar2;
  logger *plVar3;
  undefined1 local_198 [384];
  
  if ((i->version).value < 0x1030000) {
    util::load<int,util::little_endian>(is);
  }
  local_198._0_8_ = &this->name;
  local_198._8_4_ = i->codepage;
  local_198._16_8_ = &(i->header).lead_bytes;
  util::operator>>(is,(encoded_string *)local_198);
  item::load_condition_data(&this->super_item,is,i);
  windows_version_range::load(&(this->super_item).winver,is,&i->version);
  bVar1 = util::load<unsigned_char,util::little_endian>(is);
  if (bVar1 < 3) {
    tVar2 = *(target_type *)
             ((anonymous_namespace)::delete_target_type_map::values + (ulong)bVar1 * 4);
  }
  else {
    local_198._0_4_ = 2;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)(local_198 + 8));
    std::operator<<((ostream *)(local_198 + 8),"Unexpected ");
    plVar3 = logger::operator<<((logger *)local_198,
                                &enum_names<setup::delete_entry::target_type>::name);
    std::operator<<((ostream *)&plVar3->buffer," value: ");
    std::ostream::_M_insert<unsigned_long>((ulong)&plVar3->buffer);
    logger::~logger((logger *)local_198);
    tVar2 = Files;
  }
  this->type = tVar2;
  return;
}

Assistant:

void delete_entry::load(std::istream & is, const info & i) {
	
	if(i.version < INNO_VERSION(1, 3, 0)) {
		(void)util::load<boost::uint32_t>(is); // uncompressed size of the entry
	}
	
	is >> util::encoded_string(name, i.codepage, i.header.lead_bytes);
	
	load_condition_data(is, i);
	
	load_version_data(is, i.version);
	
	type = stored_enum<delete_target_type_map>(is).get();
}